

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# happly.h
# Opt level: O2

vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
* __thiscall
happly::Element::getDataFromListPropertyRecursive<unsigned_long,int>
          (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           *__return_storage_ptr__,Element *this,Property *prop)

{
  int *piVar1;
  long lVar2;
  Tcan *v;
  int *piVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> castedFlatVecCopy;
  unsigned_long local_70;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  if ((prop != (Property *)0x0) &&
     (lVar2 = __dynamic_cast(prop,&Property::typeinfo,&TypedListProperty<int>::typeinfo,0),
     lVar2 != 0)) {
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    geometrycentral::surface::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_68,
               *(long *)(lVar2 + 0x30) - *(long *)(lVar2 + 0x28) >> 2);
    piVar1 = *(int **)(lVar2 + 0x30);
    for (piVar3 = *(int **)(lVar2 + 0x28); piVar3 != piVar1; piVar3 = piVar3 + 1) {
      local_70 = (unsigned_long)*piVar3;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_68,&local_70);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(lVar2 + 0x40));
    anon_unknown_3::unflattenList<unsigned_long>
              (__return_storage_ptr__,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_68,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_48);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_68);
    return __return_storage_ptr__;
  }
  getDataFromListPropertyRecursive<unsigned_long,short>(__return_storage_ptr__,this,prop);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<D>> getDataFromListPropertyRecursive(Property* prop) {
    typedef typename CanonicalName<T>::type Tcan;

    TypedListProperty<Tcan>* castedProp = dynamic_cast<TypedListProperty<Tcan>*>(prop);
    if (castedProp) {
      // Succeeded, return a buffer of the data (copy while converting type)

      // Convert to flat buffer of new type
      std::vector<D>* castedFlatVec = nullptr;
      std::vector<D> castedFlatVecCopy; // we _might_ make a copy here, depending on is_same below

      if (std::is_same<std::vector<D>, std::vector<Tcan>>::value) {
        // just use the array we already have
        castedFlatVec = addressIfSame<std::vector<D>>(castedProp->flattenedData, 0 /* dummy arg to disambiguate */);
      } else {
        // make a copy
        castedFlatVecCopy.reserve(castedProp->flattenedData.size());
        for (Tcan& v : castedProp->flattenedData) {
          castedFlatVecCopy.push_back(static_cast<D>(v));
        }
        castedFlatVec = &castedFlatVecCopy;
      }

      // Unflatten and return
      return unflattenList(*castedFlatVec, castedProp->flattenedIndexStart);
    }

    TypeChain<Tcan> chainType;
    if (chainType.hasChildType) {
      return getDataFromListPropertyRecursive<D, typename TypeChain<Tcan>::type>(prop);
    } else {
      // No smaller type to try, failure
      throw std::runtime_error("PLY parser: list property " + prop->name +
                               " cannot be coerced to requested type list " + typeName<D>() + ". Has type list " +
                               prop->propertyTypeName());
    }
  }